

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

cio_error cio_socket_set_keep_alive
                    (cio_socket *socket,_Bool on,uint keep_idle_s,uint keep_intvl_s,uint keep_cnt)

{
  int iVar1;
  int *piVar2;
  undefined7 in_register_00000031;
  int keep_alive;
  undefined4 local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_18 = 0;
  local_14 = keep_cnt;
  local_10 = keep_intvl_s;
  local_c = keep_idle_s;
  if ((int)CONCAT71(in_register_00000031,on) != 0) {
    local_18 = 1;
    iVar1 = setsockopt((socket->impl).ev.fd,6,4,&local_c,4);
    if (((iVar1 == -1) || (iVar1 = setsockopt((socket->impl).ev.fd,6,5,&local_10,4), iVar1 == -1))
       || (iVar1 = setsockopt((socket->impl).ev.fd,6,6,&local_14,4), iVar1 == -1))
    goto LAB_001031ec;
  }
  iVar1 = setsockopt((socket->impl).ev.fd,1,9,&local_18,4);
  if (iVar1 != -1) {
    return CIO_SUCCESS;
  }
LAB_001031ec:
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

enum cio_error cio_socket_set_keep_alive(const struct cio_socket *socket, bool on, unsigned int keep_idle_s,
                                         unsigned int keep_intvl_s, unsigned int keep_cnt)
{
	int keep_alive = 0;

	if (on) {
		keep_alive = 1;
		if (setsockopt(socket->impl.ev.fd, SOL_TCP, TCP_KEEPIDLE, &keep_idle_s, sizeof(keep_idle_s)) == -1) {
			return (enum cio_error)(-errno);
		}

		if (setsockopt(socket->impl.ev.fd, SOL_TCP, TCP_KEEPINTVL, &keep_intvl_s, sizeof(keep_intvl_s)) == -1) {
			return (enum cio_error)(-errno);
		}

		if (setsockopt(socket->impl.ev.fd, SOL_TCP, TCP_KEEPCNT, &keep_cnt, sizeof(keep_cnt)) == -1) {
			return (enum cio_error)(-errno);
		}
	}

	if (setsockopt(socket->impl.ev.fd, SOL_SOCKET, SO_KEEPALIVE, &keep_alive, sizeof(keep_alive)) == -1) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}